

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes
          (ConversionStream *this,String *GLSLSource,
          IShaderSourceInputStreamFactory *pSourceStreamFactory)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  undefined8 uVar4;
  IFileStream **ppIVar5;
  IFileStream *pIVar6;
  DataBlobImpl *pDVar7;
  char *pcVar8;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*>
  *ErrInfo;
  size_t local_1d0;
  size_t NumSymbols;
  Char *IncludeText;
  RefCntAutoPtr<Diligent::DataBlobImpl> pIncludeData;
  RefCntAutoPtr<Diligent::IFileStream> local_1a8;
  RefCntAutoPtr<Diligent::IFileStream> pIncludeDataStream;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  It;
  undefined1 local_160 [8];
  String IncludeFileLowercase;
  undefined8 local_138;
  undefined8 local_130;
  allocator<char> local_121;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_110 [8];
  String IncludeName;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  char *local_e0;
  iterator IncludeNameStartPos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  char *local_c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98 [3];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  iterator IncludeStartPos;
  iterator Pos;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProcessedIncludes;
  IShaderSourceInputStreamFactory *pSourceStreamFactory_local;
  String *GLSLSource_local;
  ConversionStream *this_local;
  
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&Pos);
  do {
    IncludeStartPos._M_current = (char *)std::__cxx11::string::begin();
    local_68._M_current = (char *)std::__cxx11::string::end();
    do {
      while( true ) {
        local_70._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=(&IncludeStartPos,&local_70);
        if (!bVar1) goto LAB_00411662;
        local_80._M_current = (char *)std::__cxx11::string::end();
        local_78 = (char *)Parsing::
                           SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                     (&IncludeStartPos,&local_80,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
        IncludeStartPos._M_current = local_78;
        local_98[0]._M_current = (char *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator==(&IncludeStartPos,local_98);
        if (bVar1) goto LAB_00411662;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&IncludeStartPos);
        if (*pcVar3 == '#') break;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&IncludeStartPos);
      }
      local_68._M_current = IncludeStartPos._M_current;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&IncludeStartPos);
      local_a8._M_current = (char *)std::__cxx11::string::end();
      local_a0 = (char *)Parsing::
                         SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                   (&IncludeStartPos,&local_a8,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
      IncludeStartPos._M_current = local_a0;
      local_b0._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator==(&IncludeStartPos,&local_b0);
      if (bVar1) break;
      local_b8._M_current = (char *)std::__cxx11::string::end();
      bVar1 = Parsing::SkipString<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (&IncludeStartPos,&local_b8,"include",&IncludeStartPos);
    } while (!bVar1);
LAB_00411662:
    local_c0._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==(&IncludeStartPos,&local_c0);
    if (bVar1) {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&Pos);
      return;
    }
    local_d0._M_current = (char *)std::__cxx11::string::end();
    local_c8 = (char *)Parsing::
                       SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                 (&IncludeStartPos,&local_d0,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
    IncludeStartPos._M_current = local_c8;
    IncludeNameStartPos._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==(&IncludeStartPos,&IncludeNameStartPos);
    if (bVar1) {
      LogError<true,char[40]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2f9,(char (*) [40])"Unexpected EOF after #include directive");
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&IncludeStartPos);
    if ((*pcVar3 != '\"') &&
       (pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&IncludeStartPos), *pcVar3 != '<')) {
      LogError<true,char[52]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2fd,(char (*) [52])"Missing open quotes or \'<\' after #include directive");
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&IncludeStartPos);
    local_e0 = IncludeStartPos._M_current;
    while( true ) {
      local_e8._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&IncludeStartPos,&local_e8);
      bVar1 = false;
      if (bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&IncludeStartPos);
        bVar1 = false;
        if (*pcVar3 != '\"') {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&IncludeStartPos);
          bVar1 = *pcVar3 != '>';
        }
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&IncludeStartPos);
    }
    IncludeName.field_2._8_8_ = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      (&IncludeStartPos,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&IncludeName.field_2 + 8));
    if (bVar1) {
      LogError<true,char[55]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x307,(char (*) [55])"Missing closing quotes or \'>\' after #include directive");
    }
    local_118._M_current = local_e0;
    local_120._M_current = IncludeStartPos._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)local_110,local_118,local_120,&local_121);
    std::allocator<char>::~allocator(&local_121);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&IncludeStartPos);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_130,&local_68);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_138,&IncludeStartPos);
    IncludeFileLowercase.field_2._8_8_ = std::__cxx11::string::erase(GLSLSource,local_130,local_138)
    ;
    std::__cxx11::string::string((string *)&It.second,(string *)local_110);
    StrToLower((string *)local_160,(string *)&It.second);
    std::__cxx11::string::~string((string *)&It.second);
    pVar9 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&Pos,(value_type *)local_160);
    pIncludeDataStream.m_pObject =
         (IFileStream *)
         pVar9.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    It.first.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._0_1_ = pVar9.second;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      RefCntAutoPtr<Diligent::IFileStream>::RefCntAutoPtr(&local_1a8);
      uVar4 = std::__cxx11::string::c_str();
      RefCntAutoPtr<Diligent::IFileStream>::operator&
                ((RefCntAutoPtr<Diligent::IFileStream> *)&pIncludeData);
      ppIVar5 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IFileStream__
                          ((DoublePtrHelper *)&pIncludeData);
      (*(pSourceStreamFactory->super_IObject)._vptr_IObject[4])(pSourceStreamFactory,uVar4,ppIVar5);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&pIncludeData);
      bVar1 = RefCntAutoPtr<Diligent::IFileStream>::operator!(&local_1a8);
      if (bVar1) {
        LogError<true,char[29],std::__cxx11::string>
                  (false,"InsertIncludes",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x31c,(char (*) [29])"Failed to open include file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      }
      DataBlobImpl::Create((DataBlobImpl *)&IncludeText,0,(void *)0x0);
      pIVar6 = RefCntAutoPtr<Diligent::IFileStream>::operator->(&local_1a8);
      pDVar7 = Diligent::RefCntAutoPtr::operator_cast_to_DataBlobImpl_
                         ((RefCntAutoPtr *)&IncludeText);
      (*(pIVar6->super_IObject)._vptr_IObject[5])(pIVar6,pDVar7);
      pDVar7 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                         ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&IncludeText);
      NumSymbols = (size_t)DataBlobImpl::GetConstDataPtr<char>(pDVar7,0);
      pDVar7 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                         ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&IncludeText);
      local_1d0 = DataBlobImpl::GetSize(pDVar7);
      ErrInfo = (pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*>
                 *)std::__cxx11::string::begin();
      pcVar8 = (char *)__gnu_cxx::operator-
                                 (&local_68,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&ErrInfo);
      std::__cxx11::string::insert((ulong)GLSLSource,pcVar8,NumSymbols);
      RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&IncludeText);
      RefCntAutoPtr<Diligent::IFileStream>::~RefCntAutoPtr(&local_1a8);
    }
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_110);
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes(String& GLSLSource, IShaderSourceInputStreamFactory* pSourceStreamFactory)
{
    // Put all the includes into the set to avoid multiple inclusion
    std::unordered_set<String> ProcessedIncludes;

    try
    {
        do
        {
            // Find the first #include statement
            auto Pos             = GLSLSource.begin();
            auto IncludeStartPos = GLSLSource.end();
            while (Pos != GLSLSource.end())
            {
                // #   include "TestFile.fxh"
                Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                if (Pos == GLSLSource.end())
                    break;
                if (*Pos == '#')
                {
                    IncludeStartPos = Pos;
                    // #   include "TestFile.fxh"
                    // ^
                    ++Pos;
                    // #   include "TestFile.fxh"
                    //  ^
                    Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                    if (Pos == GLSLSource.end())
                    {
                        // End of the file reached - break
                        break;
                    }
                    // #   include "TestFile.fxh"
                    //     ^
                    if (Parsing::SkipString(Pos, GLSLSource.end(), "include", Pos))
                    {
                        // #   include "TestFile.fxh"
                        //            ^
                        break;
                    }
                    else
                    {
                        // This is not an #include directive:
                        // #define MACRO
                        // Continue search through the file
                    }
                }
                else
                    ++Pos;
            }

            // No more #include found
            if (Pos == GLSLSource.end())
                break;

            // Find open quotes
            Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Unexpected EOF after #include directive");
            // #   include "TestFile.fxh"
            //             ^
            if (*Pos != '\"' && *Pos != '<')
                LOG_ERROR_AND_THROW("Missing open quotes or \'<\' after #include directive");
            ++Pos;
            // #   include "TestFile.fxh"
            //              ^
            auto IncludeNameStartPos = Pos;
            // Find closing quotes
            while (Pos != GLSLSource.end() && *Pos != '\"' && *Pos != '>') ++Pos;
            // #   include "TestFile.fxh"
            //                          ^
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Missing closing quotes or \'>\' after #include directive");

            // Get the name of the include file
            auto IncludeName = String(IncludeNameStartPos, Pos);
            ++Pos;
            // #   include "TestFile.fxh"
            // ^                         ^
            // IncludeStartPos           Pos
            GLSLSource.erase(IncludeStartPos, Pos);

            // Convert the name to lower case
            String IncludeFileLowercase = StrToLower(IncludeName);
            // Insert the lower-case name into the set
            auto It = ProcessedIncludes.insert(IncludeFileLowercase);
            // If the name was actually inserted, which means the include encountered for the first time,
            // replace the text with the file content
            if (It.second)
            {
                RefCntAutoPtr<IFileStream> pIncludeDataStream;
                pSourceStreamFactory->CreateInputStream(IncludeName.c_str(), &pIncludeDataStream);
                if (!pIncludeDataStream)
                    LOG_ERROR_AND_THROW("Failed to open include file ", IncludeName);
                auto pIncludeData = DataBlobImpl::Create();
                pIncludeDataStream->ReadBlob(pIncludeData);

                // Get include text
                const Char* IncludeText = pIncludeData->GetConstDataPtr<Char>();
                size_t      NumSymbols  = pIncludeData->GetSize();

                // Insert the text into source
                GLSLSource.insert(IncludeStartPos - GLSLSource.begin(), IncludeText, NumSymbols);
            }
        } while (true);
    }
    catch (const std::pair<std::string::iterator, const char*>& ErrInfo)
    {
        LOG_ERROR_AND_THROW("Unable to process includes: ", ErrInfo.second);
    }
}